

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

bool google::protobuf::internal::WireFormat::SkipMessage
               (CodedInputStream *input,UnknownFieldSet *unknown_fields)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 tag;
  byte unaff_BPL;
  uint32 first_byte_or_zero;
  
  do {
    pbVar2 = input->buffer_;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      tag = (uint32)bVar1;
      first_byte_or_zero = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_005e2297;
      input->last_tag_ = (uint)bVar1;
      input->buffer_ = pbVar2 + 1;
    }
    else {
      first_byte_or_zero = 0;
LAB_005e2297:
      tag = io::CodedInputStream::ReadTagFallback(input,first_byte_or_zero);
      input->last_tag_ = tag;
    }
    if ((tag & 7) == 4 || tag == 0) {
      unaff_BPL = true;
      bVar3 = false;
    }
    else {
      bVar3 = SkipField(input,tag,unknown_fields);
      unaff_BPL = unaff_BPL & bVar3;
    }
    if (bVar3 == false) {
      return (bool)unaff_BPL;
    }
  } while( true );
}

Assistant:

bool WireFormat::SkipMessage(io::CodedInputStream* input,
                             UnknownFieldSet* unknown_fields) {
  while (true) {
    uint32 tag = input->ReadTag();
    if (tag == 0) {
      // End of input.  This is a valid place to end, so return true.
      return true;
    }

    WireFormatLite::WireType wire_type = WireFormatLite::GetTagWireType(tag);

    if (wire_type == WireFormatLite::WIRETYPE_END_GROUP) {
      // Must be the end of the message.
      return true;
    }

    if (!SkipField(input, tag, unknown_fields)) return false;
  }
}